

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroups.cpp
# Opt level: O2

optional_idx duckdb::anon_unknown_280::ReadMemoryLimit(FileSystem *fs,string *file_path)

{
  bool bVar1;
  int iVar2;
  type pFVar3;
  undefined4 extraout_var;
  undefined1 strict;
  string_t input;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_b0;
  optional_idx local_a8;
  idx_t value;
  string_t contents;
  char buffer [100];
  _func_int **pp_Var4;
  
  iVar2 = (*fs->_vptr_FileSystem[0x12])(fs,file_path,0);
  if ((char)iVar2 == '\0') {
    local_a8.index = 0xffffffffffffffff;
  }
  else {
    (*fs->_vptr_FileSystem[2])(&local_b0,fs,file_path,1,0x100,0);
    pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                        *)&local_b0);
    pp_Var4 = fs->_vptr_FileSystem;
    iVar2 = (*pp_Var4[5])(fs,pFVar3,buffer);
    strict = SUB81(pp_Var4,0);
    buffer[CONCAT44(extraout_var,iVar2)] = '\0';
    string_t::string_t(&contents,buffer);
    input.value.pointer.ptr = (char *)&value;
    input.value._0_8_ = contents.value.pointer.ptr;
    bVar1 = TryCast::Operation<duckdb::string_t,unsigned_long>
                      ((TryCast *)contents.value._0_8_,input,(uint64_t *)0x0,(bool)strict);
    if (bVar1) {
      optional_idx::optional_idx(&local_a8,value);
    }
    else {
      local_a8.index = 0xffffffffffffffff;
    }
    if (local_b0._M_head_impl != (FileHandle *)0x0) {
      (*(local_b0._M_head_impl)->_vptr_FileHandle[1])();
    }
  }
  return (optional_idx)local_a8.index;
}

Assistant:

static optional_idx ReadMemoryLimit(FileSystem &fs, const string &file_path) {
	if (!fs.FileExists(file_path)) {
		return optional_idx();
	}

	auto handle = fs.OpenFile(file_path, FileFlags::FILE_FLAGS_READ);
	char buffer[100];
	auto bytes_read = fs.Read(*handle, buffer, 99);
	buffer[bytes_read] = '\0';

	auto contents = string_t(buffer);
	idx_t value;
	if (TryCast::Operation<string_t, idx_t>(contents, value)) {
		return optional_idx(value);
	}
	return optional_idx();
}